

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::StringLiteral::fromSyntax(ASTContext *context,LiteralExpressionSyntax *syntax)

{
  span<const_std::byte,_18446744073709551615UL> bytes_00;
  SourceRange sourceRange;
  bool bVar1;
  size_type sVar2;
  Expression *pEVar3;
  StringLiteral *pSVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  Type *type;
  char c;
  reverse_iterator<const_char_*> __end3;
  reverse_iterator<const_char_*> __begin3;
  reverse_view<std::basic_string_view<char,_std::char_traits<char>_>_> *__range3;
  SmallVector<std::byte,_40UL> bytes;
  Compilation *comp;
  ConstantValue *intVal;
  bitwidth_t width;
  string_view value;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  Compilation *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  bitwidth_t in_stack_fffffffffffffe0c;
  Diagnostic *in_stack_fffffffffffffe10;
  ASTContext *in_stack_fffffffffffffe18;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe20;
  SourceLocation in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  DiagCode code;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  SyntaxNode *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe60;
  Type *in_stack_fffffffffffffe68;
  Compilation *in_stack_fffffffffffffe70;
  bitmask<slang::ast::IntegralFlags> local_159;
  Type *local_158;
  bitwidth_t in_stack_fffffffffffffec4;
  Compilation *in_stack_fffffffffffffec8;
  bitmask<slang::ast::IntegralFlags> in_stack_fffffffffffffed7;
  reverse_iterator<const_char_*> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  basic_string_view<char,_std::char_traits<char>_> *local_e0;
  SourceRange local_98;
  undefined4 local_88;
  Compilation *local_40;
  Type *local_38;
  uint local_2c;
  string_view local_28 [2];
  
  code = SUB84((ulong)in_stack_fffffffffffffe30 >> 0x20,0);
  local_28[0] = parsing::Token::valueText((Token *)in_stack_fffffffffffffe10);
  local_40 = ASTContext::getCompilation((ASTContext *)0xa19f67);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_28);
  if (bVar1) {
    local_2c = 8;
    in_stack_fffffffffffffe70 = local_40;
    SVInt::SVInt((SVInt *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                 (uint64_t)in_stack_fffffffffffffe00,(bool)in_stack_fffffffffffffdff);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe00,
               (SVInt *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    in_stack_fffffffffffffe68 =
         (Type *)Compilation::allocConstant
                           (in_stack_fffffffffffffe00,
                            (ConstantValue *)
                            CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    local_38 = in_stack_fffffffffffffe68;
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1a005);
    SVInt::~SVInt((SVInt *)in_stack_fffffffffffffe10);
    bVar5._M_str = (char *)in_stack_fffffffffffffe50;
    bVar5._M_len = in_stack_fffffffffffffe58;
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(local_28);
    local_2c = (uint)(sVar2 << 3);
    if (0xffffff < local_2c) {
      local_88 = 0x1d0009;
      local_98 = slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffe50);
      sourceRange.endLoc = in_stack_fffffffffffffe28;
      sourceRange.startLoc = (SourceLocation)in_stack_fffffffffffffe20._M_extent_value;
      ASTContext::addDiag(in_stack_fffffffffffffe18,code,sourceRange);
      Diagnostic::operator<<<unsigned_int>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      Diagnostic::operator<<<unsigned_int>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      pEVar3 = Expression::badExpr(in_stack_fffffffffffffe00,
                                   (Expression *)
                                   CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      return pEVar3;
    }
    SmallVector<std::byte,_40UL>::SmallVector((SmallVector<std::byte,_40UL> *)0xa1a128);
    bVar5 = (basic_string_view<char,_std::char_traits<char>_>)
            std::ranges::views::_Reverse::
            operator()<std::basic_string_view<char,_std::char_traits<char>_>_&>
                      ((_Reverse *)in_stack_fffffffffffffe10,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    local_e0 = &local_f0;
    local_f0 = bVar5;
    std::ranges::reverse_view<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
              ((reverse_view<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    std::ranges::reverse_view<std::basic_string_view<char,_std::char_traits<char>_>_>::end
              ((reverse_view<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    while( true ) {
      in_stack_fffffffffffffe4f =
           std::operator==<const_char_*>
                     ((reverse_iterator<const_char_*> *)in_stack_fffffffffffffe00,
                      (reverse_iterator<const_char_*> *)
                      CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      if (((in_stack_fffffffffffffe4f ^ 0xff) & 1) == 0) break;
      std::reverse_iterator<const_char_*>::operator*(&local_f8);
      SmallVectorBase<std::byte>::push_back
                ((SmallVectorBase<std::byte> *)in_stack_fffffffffffffe00,
                 (byte *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      std::reverse_iterator<const_char_*>::operator++(&local_f8);
    }
    std::span<const_std::byte,_18446744073709551615UL>::span<slang::SmallVector<std::byte,_40UL>_&>
              ((span<const_std::byte,_18446744073709551615UL> *)in_stack_fffffffffffffe10,
               (SmallVector<std::byte,_40UL> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    bytes_00._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
    bytes_00._M_ptr = (pointer)in_stack_fffffffffffffe18;
    SVInt::SVInt((SVInt *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,bytes_00,
                 SUB41((uint)in_stack_fffffffffffffe08 >> 0x18,0));
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffe00,
               (SVInt *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    local_38 = (Type *)Compilation::allocConstant
                                 (in_stack_fffffffffffffe00,
                                  (ConstantValue *)
                                  CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa1a2dc);
    SVInt::~SVInt((SVInt *)in_stack_fffffffffffffe10);
    SmallVector<std::byte,_40UL>::~SmallVector((SmallVector<std::byte,_40UL> *)0xa1a2f6);
  }
  bitmask<slang::ast::IntegralFlags>::bitmask(&local_159,TwoState);
  local_158 = Compilation::getType
                        (in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                         in_stack_fffffffffffffed7);
  parsing::Token::rawText((Token *)local_40);
  slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)bVar5._M_str);
  pSVar4 = BumpAllocator::
           emplace<slang::ast::StringLiteral,slang::ast::Type_const&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue&,slang::SourceRange>
                     (&in_stack_fffffffffffffe70->super_BumpAllocator,in_stack_fffffffffffffe68,
                      in_stack_fffffffffffffe60,
                      (basic_string_view<char,_std::char_traits<char>_> *)bVar5._M_len,
                      (ConstantValue *)bVar5._M_str,
                      (SourceRange *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  return &pSVar4->super_Expression;
}

Assistant:

Expression& StringLiteral::fromSyntax(const ASTContext& context,
                                      const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::StringLiteralExpression);

    std::string_view value = syntax.literal.valueText();
    bitwidth_t width;
    ConstantValue* intVal;

    auto& comp = context.getCompilation();
    if (value.empty()) {
        // [11.10.3] says that empty string literals take on a value of "\0" (8 zero bits).
        width = 8;
        intVal = comp.allocConstant(SVInt(8, 0, false));
    }
    else {
        width = bitwidth_t(value.size() * 8);
        if (width > (uint32_t)SVInt::MAX_BITS) {
            context.addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                << width << (uint32_t)SVInt::MAX_BITS;
            return badExpr(comp, nullptr);
        }

        // String literals represented as integers put the first character on the
        // left, which translates to the msb, so we have to reverse the string.
        SmallVector<byte> bytes;
        for (char c : std::views::reverse(value))
            bytes.push_back((byte)c);

        intVal = comp.allocConstant(SVInt(width, bytes, false));
    }

    auto& type = comp.getType(width, IntegralFlags::Unsigned);
    return *comp.emplace<StringLiteral>(type, value, syntax.literal.rawText(), *intVal,
                                        syntax.sourceRange());
}